

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O0

level_enum spdlog::level::from_str(string *name)

{
  basic_string_view<char> lhs;
  bool bVar1;
  string_view_t *level_str;
  string_view_t *__end2;
  string_view_t *__begin2;
  string_view_t (*__range2) [7];
  int level;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  undefined5 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  basic_string_view<char> in_stack_ffffffffffffffa8;
  char *pcVar2;
  size_t sVar3;
  registry *local_28;
  level_enum local_14;
  level_enum local_4;
  
  local_14 = trace;
  local_28 = (registry *)level_string_views;
  while( true ) {
    if (local_28 == &details::registry::instance::s_instance) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffffa7,
                                       CONCAT16(in_stack_ffffffffffffffa6,
                                                CONCAT15(in_stack_ffffffffffffffa5,
                                                         in_stack_ffffffffffffffa0))),
                              (char *)in_stack_ffffffffffffff98);
      if (bVar1) {
        local_4 = warn;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffffa7,
                                          CONCAT16(bVar1,CONCAT15(in_stack_ffffffffffffffa5,
                                                                  in_stack_ffffffffffffffa0))),
                                (char *)in_stack_ffffffffffffff98);
        if (bVar1) {
          local_4 = err;
        }
        else {
          local_4 = off;
        }
      }
      return local_4;
    }
    pcVar2 = (char *)(local_28->logger_map_mutex_).super___mutex_base._M_mutex.__align;
    sVar3 = *(size_t *)((long)&(local_28->logger_map_mutex_).super___mutex_base._M_mutex + 8);
    ::fmt::v6::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)
               CONCAT17(in_stack_ffffffffffffffa7,
                        CONCAT16(in_stack_ffffffffffffffa6,
                                 CONCAT15(in_stack_ffffffffffffffa5,in_stack_ffffffffffffffa0))),
               in_stack_ffffffffffffff98);
    lhs.size_ = sVar3;
    lhs.data_ = pcVar2;
    in_stack_ffffffffffffffa7 = ::fmt::v6::operator==(lhs,in_stack_ffffffffffffffa8);
    if ((bool)in_stack_ffffffffffffffa7) break;
    local_14 = local_14 + debug;
    local_28 = (registry *)((long)&(local_28->logger_map_mutex_).super___mutex_base._M_mutex + 0x10)
    ;
  }
  return local_14;
}

Assistant:

SPDLOG_INLINE spdlog::level::level_enum from_str(const std::string &name) SPDLOG_NOEXCEPT
{
    int level = 0;
    for (const auto &level_str : level_string_views)
    {
        if (level_str == name)
        {
            return static_cast<level::level_enum>(level);
        }
        level++;
    }
    // check also for "warn" and "err" before giving up..
    if (name == "warn")
    {
        return level::warn;
    }
    if (name == "err")
    {
        return level::err;
    }
    return level::off;
}